

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

bool __thiscall
SQCompilation::CodegenVisitor::CheckMemberUniqueness
          (CodegenVisitor *this,ArenaVector<SQCompilation::Expr_*> *vec,Expr *obj)

{
  TreeOp TVar1;
  uint uVar2;
  TreeOp TVar3;
  Expr **ppEVar4;
  Expr *pEVar5;
  int iVar6;
  _func_int **__s1;
  TreeOp TVar7;
  ulong uVar8;
  Expr *obj_local;
  char b [32];
  
  TVar1 = (obj->super_Node)._op;
  if ((TVar1 == TO_LITERAL) || (TVar1 == TO_ID)) {
    uVar2 = vec->_size;
    ppEVar4 = vec->_vals;
    obj_local = obj;
    TVar7 = TVar1;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      pEVar5 = ppEVar4[uVar8];
      TVar3 = (pEVar5->super_Node)._op;
      if (TVar3 == TO_LITERAL) {
        if (TVar7 == TO_LITERAL) {
          iVar6 = *(int *)&(pEVar5->super_Node).field_0x1c;
          TVar7 = TO_LITERAL;
          if (iVar6 == *(int *)&(obj->super_Node).field_0x1c) {
            if (iVar6 == 0) {
              __s1 = pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj;
              iVar6 = strcmp((char *)__s1,(char *)obj[1].super_Node.super_ArenaObj._vptr_ArenaObj);
              TVar7 = TO_LITERAL;
              goto LAB_00157df5;
            }
            if (pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj ==
                obj[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
              __s1 = (_func_int **)b;
              b[0x10] = '\0';
              b[0x11] = '\0';
              b[0x12] = '\0';
              b[0x13] = '\0';
              b[0x14] = '\0';
              b[0x15] = '\0';
              b[0x16] = '\0';
              b[0x17] = '\0';
              b[0x18] = '\0';
              b[0x19] = '\0';
              b[0x1a] = '\0';
              b[0x1b] = '\0';
              b[0x1c] = '\0';
              b[0x1d] = '\0';
              b[0x1e] = '\0';
              b[0x1f] = '\0';
              b[0] = '\0';
              b[1] = '\0';
              b[2] = '\0';
              b[3] = '\0';
              b[4] = '\0';
              b[5] = '\0';
              b[6] = '\0';
              b[7] = '\0';
              b[8] = '\0';
              b[9] = '\0';
              b[10] = '\0';
              b[0xb] = '\0';
              b[0xc] = '\0';
              b[0xd] = '\0';
              b[0xe] = '\0';
              b[0xf] = '\0';
              snprintf((char *)__s1,0x20,"%lu");
              goto LAB_00157e9f;
            }
          }
        }
      }
      else if ((TVar3 == TO_ID) && (TVar7 = TVar1, TVar1 == TO_ID)) {
        __s1 = obj[1].super_Node.super_ArenaObj._vptr_ArenaObj;
        iVar6 = strcmp((char *)pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj,(char *)__s1);
        TVar7 = TO_ID;
LAB_00157df5:
        if (iVar6 == 0) {
LAB_00157e9f:
          reportDiagnostic(this,&obj->super_Node,0x30,__s1);
          return false;
        }
      }
    }
    ArenaVector<SQCompilation::Expr_*>::push_back(vec,&obj_local);
  }
  return true;
}

Assistant:

bool CodegenVisitor::CheckMemberUniqueness(ArenaVector<Expr *> &vec, Expr *obj) {

    if (obj->op() != TO_LITERAL && obj->op() != TO_ID) return true;

    for (SQUnsignedInteger i = 0, n = vec.size(); i < n; ++i) {
        Expr *vecobj = vec[i];
        if (vecobj->op() == TO_ID && obj->op() == TO_ID) {
            if (strcmp(vecobj->asId()->id(), obj->asId()->id()) == 0) {
                reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, obj->asId()->id());
                return false;
            }
            continue;
        }
        if (vecobj->op() == TO_LITERAL && obj->op() == TO_LITERAL) {
            LiteralExpr *a = (LiteralExpr*)vecobj;
            LiteralExpr *b = (LiteralExpr*)obj;
            if (compareLiterals(a, b)) {
                if (a->kind() == LK_STRING) {
                    reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, a->s());
                }
                else {
                    char b[32] = { 0 };
                    snprintf(b, sizeof b, "%" SQ_UINT_FMT, a->raw());
                    reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, b);
                }
                return false;
            }
            continue;
        }
    }

    vec.push_back(obj);
    return true;
}